

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)27>::~BlockExprBase(BlockExprBase<(wabt::ExprType)27> *this)

{
  ~BlockExprBase(this);
  operator_delete(this,0x188);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}